

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_key_exchange(ptls_key_exchange_algorithm_t *client,ptls_key_exchange_algorithm_t *server)

{
  ptls_iovec_t pVar1;
  int iVar2;
  ptls_iovec_t server_secret;
  ptls_iovec_t server_pubkey;
  ptls_key_exchange_context_t *ctx;
  ptls_iovec_t client_secret;
  
  iVar2 = (*server->exchange)(server,&server_pubkey,&server_secret,(ptls_iovec_t)ZEXT816(0));
  _ok((uint)(iVar2 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x640);
  iVar2 = (*client->create)(client,&ctx);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x644);
  iVar2 = (*server->exchange)(server,&server_pubkey,&server_secret,ctx->pubkey);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x646);
  pVar1.len = server_pubkey.len;
  pVar1.base = server_pubkey.base;
  iVar2 = (*ctx->on_exchange)(&ctx,1,&client_secret,pVar1);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x648);
  _ok((uint)(client_secret.len == server_secret.len),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x649);
  iVar2 = bcmp(client_secret.base,server_secret.base,client_secret.len);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x64a);
  free(client_secret.base);
  free(server_pubkey.base);
  free(server_secret.base);
  iVar2 = (*client->create)(client,&ctx);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c");
  iVar2 = (*ctx->on_exchange)(&ctx,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x654);
  _ok((uint)(ctx == (ptls_key_exchange_context_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x655);
  return;
}

Assistant:

void test_key_exchange(ptls_key_exchange_algorithm_t *client, ptls_key_exchange_algorithm_t *server)
{
    ptls_key_exchange_context_t *ctx;
    ptls_iovec_t client_secret, server_pubkey, server_secret;
    int ret;

    /* fail */
    ret = server->exchange(server, &server_pubkey, &server_secret, (ptls_iovec_t){NULL});
    ok(ret != 0);

    /* perform ecdh */
    ret = client->create(client, &ctx);
    ok(ret == 0);
    ret = server->exchange(server, &server_pubkey, &server_secret, ctx->pubkey);
    ok(ret == 0);
    ret = ctx->on_exchange(&ctx, 1, &client_secret, server_pubkey);
    ok(ret == 0);
    ok(client_secret.len == server_secret.len);
    ok(memcmp(client_secret.base, server_secret.base, client_secret.len) == 0);

    free(client_secret.base);
    free(server_pubkey.base);
    free(server_secret.base);

    /* client abort */
    ret = client->create(client, &ctx);
    ok(ret == 0);
    ret = ctx->on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    ok(ret == 0);
    ok(ctx == NULL);
}